

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall FunctionCall::Action(FunctionCall *this)

{
  compile_errcode cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_74;
  int local_70;
  int character_number;
  int line_number;
  SymbolName local_5c;
  undefined1 local_58 [4];
  SymbolName name;
  string identifier_name;
  vector<_SymbolType,_std::allocator<_SymbolType>_> argument_type;
  int state;
  int ret;
  FunctionCall *this_local;
  
  argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<_SymbolType,_std::allocator<_SymbolType>_>::vector
            ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)
             ((long)&identifier_name.field_2 + 8));
  std::__cxx11::string::string((string *)local_58);
  do {
    local_5c = SymbolQueue::GetCurrentName(handle_correct_queue);
    local_70 = SymbolQueue::GetCurrentLine(handle_correct_queue);
    local_74 = SymbolQueue::GetCurrentCharacter(handle_correct_queue);
    switch((int)argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    case 0:
      if (local_5c != IDENTIFIER_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001957bf;
      }
      SymbolQueue::GetCurrentValue<std::__cxx11::string>(&local_98,handle_correct_queue);
      std::__cxx11::string::operator=((string *)local_58,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      IdentifierCheck((string *)local_58,local_70,local_74);
      argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      break;
    case 1:
      if (local_5c != L_CIRCLE_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001957bf;
      }
      argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
      break;
    case 2:
      cVar1 = ValueArgumentList::Action
                        (&this->m_value_argument_list,
                         (vector<_SymbolType,_std::allocator<_SymbolType>_> *)
                         ((long)&identifier_name.field_2 + 8));
      if (cVar1 != 0) {
        this_local._4_4_ = -1;
        goto LAB_001957bf;
      }
      ArgumentCheck((string *)local_58,local_70,local_74,
                    (vector<_SymbolType,_std::allocator<_SymbolType>_> *)
                    ((long)&identifier_name.field_2 + 8));
      argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
      break;
    case 3:
      if (local_5c != R_CIRCLE_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001957bf;
      }
      argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      break;
    case 4:
      this_local._4_4_ = 0;
LAB_001957bf:
      std::__cxx11::string::~string((string *)local_58);
      std::vector<_SymbolType,_std::allocator<_SymbolType>_>::~vector
                ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)
                 ((long)&identifier_name.field_2 + 8));
      return this_local._4_4_;
    }
    if ((int)argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != 3) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
  } while( true );
}

Assistant:

compile_errcode FunctionCall::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    vector<SymbolType> argument_type;
    string identifier_name;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == IDENTIFIER_SYM) {
                    identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    IdentifierCheck(identifier_name, line_number, character_number);
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_value_argument_list.Action(argument_type)) == COMPILE_OK) {
                    ArgumentCheck(identifier_name, line_number, character_number, argument_type);
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_correct_queue->NextSymbol();
    }
}